

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O3

Matrix4f * __thiscall
Matrix4f::inverse(Matrix4f *__return_storage_ptr__,Matrix4f *this,bool *pbIsSingular,float epsilon)

{
  float m12;
  float m20;
  float m00;
  float m10;
  float m21;
  float m01;
  float m11;
  float m22;
  float m12_00;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  
  fVar17 = this->m_elements[0];
  fVar16 = this->m_elements[1];
  m12 = this->m_elements[2];
  fVar12 = this->m_elements[3];
  m20 = this->m_elements[4];
  m00 = this->m_elements[5];
  m10 = this->m_elements[6];
  fVar13 = this->m_elements[7];
  m21 = this->m_elements[8];
  m01 = this->m_elements[9];
  m11 = this->m_elements[10];
  fVar14 = this->m_elements[0xb];
  m22 = this->m_elements[0xc];
  fVar15 = this->m_elements[0xd];
  m12_00 = this->m_elements[0xe];
  fVar11 = this->m_elements[0xf];
  fVar1 = Matrix3f::determinant3x3(m00,m01,fVar15,m10,m11,m12_00,fVar13,fVar14,fVar11);
  fVar2 = Matrix3f::determinant3x3(m01,fVar15,fVar16,m11,m12_00,m12,fVar14,fVar11,fVar12);
  fVar3 = Matrix3f::determinant3x3(fVar15,fVar16,m00,m12_00,m12,m10,fVar11,fVar12,fVar13);
  fVar4 = Matrix3f::determinant3x3(fVar16,m00,m01,m12,m10,m11,fVar12,fVar13,fVar14);
  fVar5 = Matrix3f::determinant3x3(m10,m11,m12_00,fVar13,fVar14,fVar11,m20,m21,m22);
  fVar6 = Matrix3f::determinant3x3(m11,m12_00,m12,fVar14,fVar11,fVar12,m21,m22,fVar17);
  fVar7 = Matrix3f::determinant3x3(m12_00,m12,m10,fVar11,fVar12,fVar13,m22,fVar17,m20);
  fVar8 = Matrix3f::determinant3x3(m12,m10,m11,fVar12,fVar13,fVar14,fVar17,m20,m21);
  fVar9 = Matrix3f::determinant3x3(fVar13,fVar14,fVar11,m20,m21,m22,m00,m01,fVar15);
  fVar10 = Matrix3f::determinant3x3(fVar14,fVar11,fVar12,m21,m22,fVar17,m01,fVar15,fVar16);
  fVar11 = Matrix3f::determinant3x3(fVar11,fVar12,fVar13,m22,fVar17,m20,fVar15,fVar16,m00);
  fVar12 = Matrix3f::determinant3x3(fVar12,fVar13,fVar14,fVar17,m20,m21,fVar16,m00,m01);
  fVar13 = Matrix3f::determinant3x3(m20,m21,m22,m00,m01,fVar15,m10,m11,m12_00);
  fVar14 = Matrix3f::determinant3x3(m21,m22,fVar17,m01,fVar15,fVar16,m11,m12_00,m12);
  fVar15 = Matrix3f::determinant3x3(m22,fVar17,m20,fVar15,fVar16,m00,m12_00,m12,m10);
  fVar16 = Matrix3f::determinant3x3(fVar17,m20,m21,fVar16,m00,m01,m12,m10,m11);
  fVar17 = (m21 * fVar3 + (fVar17 * fVar1 - m20 * fVar2)) - m22 * fVar4;
  if (epsilon <= ABS(fVar17)) {
    if (pbIsSingular != (bool *)0x0) {
      *pbIsSingular = false;
    }
    fVar17 = 1.0 / fVar17;
    __return_storage_ptr__->m_elements[0] = fVar1 * fVar17;
    __return_storage_ptr__->m_elements[1] = -fVar2 * fVar17;
    __return_storage_ptr__->m_elements[2] = fVar3 * fVar17;
    __return_storage_ptr__->m_elements[3] = -fVar4 * fVar17;
    __return_storage_ptr__->m_elements[4] = -fVar5 * fVar17;
    __return_storage_ptr__->m_elements[5] = fVar6 * fVar17;
    __return_storage_ptr__->m_elements[6] = -fVar7 * fVar17;
    __return_storage_ptr__->m_elements[7] = fVar8 * fVar17;
    __return_storage_ptr__->m_elements[8] = fVar9 * fVar17;
    __return_storage_ptr__->m_elements[9] = -fVar10 * fVar17;
    __return_storage_ptr__->m_elements[10] = fVar11 * fVar17;
    __return_storage_ptr__->m_elements[0xb] = -fVar12 * fVar17;
    __return_storage_ptr__->m_elements[0xc] = -fVar13 * fVar17;
    __return_storage_ptr__->m_elements[0xd] = fVar14 * fVar17;
    __return_storage_ptr__->m_elements[0xe] = -fVar15 * fVar17;
    __return_storage_ptr__->m_elements[0xf] = fVar16 * fVar17;
  }
  else {
    if (pbIsSingular != (bool *)0x0) {
      *pbIsSingular = true;
    }
    __return_storage_ptr__->m_elements[0xc] = 0.0;
    __return_storage_ptr__->m_elements[0xd] = 0.0;
    __return_storage_ptr__->m_elements[0xe] = 0.0;
    __return_storage_ptr__->m_elements[0xf] = 0.0;
    __return_storage_ptr__->m_elements[8] = 0.0;
    __return_storage_ptr__->m_elements[9] = 0.0;
    __return_storage_ptr__->m_elements[10] = 0.0;
    __return_storage_ptr__->m_elements[0xb] = 0.0;
    __return_storage_ptr__->m_elements[4] = 0.0;
    __return_storage_ptr__->m_elements[5] = 0.0;
    __return_storage_ptr__->m_elements[6] = 0.0;
    __return_storage_ptr__->m_elements[7] = 0.0;
    __return_storage_ptr__->m_elements[0] = 0.0;
    __return_storage_ptr__->m_elements[1] = 0.0;
    __return_storage_ptr__->m_elements[2] = 0.0;
    __return_storage_ptr__->m_elements[3] = 0.0;
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix4f Matrix4f::inverse( bool* pbIsSingular, float epsilon ) const
{
	float m00 = m_elements[ 0 ];
	float m10 = m_elements[ 1 ];
	float m20 = m_elements[ 2 ];
	float m30 = m_elements[ 3 ];

	float m01 = m_elements[ 4 ];
	float m11 = m_elements[ 5 ];
	float m21 = m_elements[ 6 ];
	float m31 = m_elements[ 7 ];

	float m02 = m_elements[ 8 ];
	float m12 = m_elements[ 9 ];
	float m22 = m_elements[ 10 ];
	float m32 = m_elements[ 11 ];

	float m03 = m_elements[ 12 ];
	float m13 = m_elements[ 13 ];
	float m23 = m_elements[ 14 ];
	float m33 = m_elements[ 15 ];

    float cofactor00 =  Matrix3f::determinant3x3( m11, m12, m13, m21, m22, m23, m31, m32, m33 );
    float cofactor01 = -Matrix3f::determinant3x3( m12, m13, m10, m22, m23, m20, m32, m33, m30 );
    float cofactor02 =  Matrix3f::determinant3x3( m13, m10, m11, m23, m20, m21, m33, m30, m31 );
    float cofactor03 = -Matrix3f::determinant3x3( m10, m11, m12, m20, m21, m22, m30, m31, m32 );
    
    float cofactor10 = -Matrix3f::determinant3x3( m21, m22, m23, m31, m32, m33, m01, m02, m03 );
    float cofactor11 =  Matrix3f::determinant3x3( m22, m23, m20, m32, m33, m30, m02, m03, m00 );
    float cofactor12 = -Matrix3f::determinant3x3( m23, m20, m21, m33, m30, m31, m03, m00, m01 );
    float cofactor13 =  Matrix3f::determinant3x3( m20, m21, m22, m30, m31, m32, m00, m01, m02 );
    
    float cofactor20 =  Matrix3f::determinant3x3( m31, m32, m33, m01, m02, m03, m11, m12, m13 );
    float cofactor21 = -Matrix3f::determinant3x3( m32, m33, m30, m02, m03, m00, m12, m13, m10 );
    float cofactor22 =  Matrix3f::determinant3x3( m33, m30, m31, m03, m00, m01, m13, m10, m11 );
    float cofactor23 = -Matrix3f::determinant3x3( m30, m31, m32, m00, m01, m02, m10, m11, m12 );
    
    float cofactor30 = -Matrix3f::determinant3x3( m01, m02, m03, m11, m12, m13, m21, m22, m23 );
    float cofactor31 =  Matrix3f::determinant3x3( m02, m03, m00, m12, m13, m10, m22, m23, m20 );
    float cofactor32 = -Matrix3f::determinant3x3( m03, m00, m01, m13, m10, m11, m23, m20, m21 );
    float cofactor33 =  Matrix3f::determinant3x3( m00, m01, m02, m10, m11, m12, m20, m21, m22 );

	float determinant = m00 * cofactor00 + m01 * cofactor01 + m02 * cofactor02 + m03 * cofactor03;

	bool isSingular = ( fabs( determinant ) < epsilon );
	if( isSingular )
	{
		if( pbIsSingular != NULL )
		{
			*pbIsSingular = true;
		}
		return Matrix4f();
	}
	else
	{
		if( pbIsSingular != NULL )
		{
			*pbIsSingular = false;
		}

		float reciprocalDeterminant = 1.0f / determinant;

		return Matrix4f
			(
				cofactor00 * reciprocalDeterminant, cofactor10 * reciprocalDeterminant, cofactor20 * reciprocalDeterminant, cofactor30 * reciprocalDeterminant,
				cofactor01 * reciprocalDeterminant, cofactor11 * reciprocalDeterminant, cofactor21 * reciprocalDeterminant, cofactor31 * reciprocalDeterminant,
				cofactor02 * reciprocalDeterminant, cofactor12 * reciprocalDeterminant, cofactor22 * reciprocalDeterminant, cofactor32 * reciprocalDeterminant,
				cofactor03 * reciprocalDeterminant, cofactor13 * reciprocalDeterminant, cofactor23 * reciprocalDeterminant, cofactor33 * reciprocalDeterminant
			);
	}
}